

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

X509 * x509_from_pem(char *pem)

{
  size_t sVar1;
  BIO *bp;
  X509 *pXVar2;
  X509 *cert;
  BIO *bio;
  char *pem_local;
  
  sVar1 = strlen(pem);
  bp = BIO_new_mem_buf(pem,(int)sVar1);
  pXVar2 = PEM_read_bio_X509(bp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
  if (pXVar2 == (X509 *)0x0) {
    __assert_fail("cert != NULL && \"failed to load certificate\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",0xfd
                  ,"X509 *x509_from_pem(const char *)");
  }
  BIO_free(bp);
  return (X509 *)pXVar2;
}

Assistant:

static X509 *x509_from_pem(const char *pem)
{
    BIO *bio = BIO_new_mem_buf((void *)pem, (int)strlen(pem));
    X509 *cert = PEM_read_bio_X509(bio, NULL, NULL, NULL);
    assert(cert != NULL && "failed to load certificate");
    BIO_free(bio);
    return cert;
}